

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O2

BindResult __thiscall
QOpenGLTextureCache::bindTexture
          (QOpenGLTextureCache *this,QOpenGLContext *context,qint64 key,QImage *image,
          BindOptions options)

{
  long *plVar1;
  ulong uVar2;
  QOpenGLCachedTexture *this_00;
  long in_FS_OFFSET;
  unsigned_long_long local_48;
  GLuint id;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  id = 0xaaaaaaaa;
  plVar1 = (long *)QOpenGLContext::functions();
  (**(code **)(*plVar1 + 0xa8))(1,&id);
  (**(code **)*plVar1)(0xde1,id);
  uVar2 = QOpenGLTextureUploader::textureImage(0xde1,image,options,(QSize)0xffffffffffffffff);
  local_48 = key;
  this_00 = (QOpenGLCachedTexture *)operator_new(0x10);
  QOpenGLCachedTexture::QOpenGLCachedTexture(this_00,id,options,context);
  QCache<unsigned_long_long,_QOpenGLCachedTexture>::insert
            (&this->m_cache,&local_48,this_00,
             (long)(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                        0x400));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (BindResult)((ulong)id | 0x100000000);
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLTextureCache::BindResult QOpenGLTextureCache::bindTexture(QOpenGLContext *context,
                                                                 qint64 key,
                                                                 const QImage &image,
                                                                 QOpenGLTextureUploader::BindOptions options)
{
    Q_TRACE_SCOPE(QOpenGLTextureCache_bindTexture, context, key, image.bits(), options);

    GLuint id;
    QOpenGLFunctions *funcs = context->functions();
    funcs->glGenTextures(1, &id);
    funcs->glBindTexture(GL_TEXTURE_2D, id);

    int cost = QOpenGLTextureUploader::textureImage(GL_TEXTURE_2D, image, options);

    m_cache.insert(key, new QOpenGLCachedTexture(id, options, context), cost / 1024);

    return { id, BindResultFlag::NewTexture };
}